

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::ConstraintPrototypeSyntax::ConstraintPrototypeSyntax
          (ConstraintPrototypeSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,TokenList *qualifiers,
          Token keyword,NameSyntax *name,Token semi)

{
  size_type sVar1;
  pointer ppAVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  
  uVar5 = keyword._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.kind = ConstraintPrototype;
  SVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       data_;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004ea348;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar6 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar6) = this;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  SVar3 = (qualifiers->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(qualifiers->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent =
       (qualifiers->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_004e9f08;
  (this->qualifiers).super_SyntaxListBase.childCount = (qualifiers->super_SyntaxListBase).childCount
  ;
  sVar1 = (qualifiers->super_span<slang::parsing::Token,_18446744073709551615UL>).size_;
  (this->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>.data_ =
       (qualifiers->super_span<slang::parsing::Token,_18446744073709551615UL>).data_;
  (this->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>.size_ = sVar1;
  (this->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004e9e50;
  (this->keyword).kind = (short)uVar5;
  (this->keyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->keyword).info = keyword.info;
  (this->name).ptr = name;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  (name->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  return;
}

Assistant:

ConstraintPrototypeSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, const TokenList& qualifiers, Token keyword, NameSyntax& name, Token semi) :
        MemberSyntax(SyntaxKind::ConstraintPrototype, attributes), qualifiers(qualifiers), keyword(keyword), name(&name), semi(semi) {
        this->qualifiers.parent = this;
        this->name->parent = this;
    }